

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_39dd::test_iterator_reinit(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_iterator_t *it;
  uint64_t uVar2;
  
  r = roaring64_bitmap_create();
  roaring64_bitmap_add(r,0);
  roaring64_bitmap_add(r,0x800000000);
  roaring64_bitmap_add(r,0x800000001);
  roaring64_bitmap_add(r,0x800000002);
  roaring64_bitmap_add(r,0x1000000000);
  it = roaring64_iterator_create(r);
  _Var1 = roaring64_iterator_advance(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5f2);
  _Var1 = roaring64_iterator_advance(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5f3);
  _Var1 = roaring64_iterator_advance(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5f4);
  _Var1 = roaring64_iterator_previous(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5f5);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5f6);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x800000001,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5f7);
  roaring64_iterator_reinit(r,it);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5fa);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5fb);
  roaring64_iterator_free(it);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_reinit) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 1ULL << 35);
    roaring64_bitmap_add(r, (1ULL << 35) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 2);
    roaring64_bitmap_add(r, (1ULL << 36));

    roaring64_iterator_t* it = roaring64_iterator_create(r);
    assert_true(roaring64_iterator_advance(it));
    assert_true(roaring64_iterator_advance(it));
    assert_true(roaring64_iterator_advance(it));
    assert_true(roaring64_iterator_previous(it));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), ((1ULL << 35) + 1));

    roaring64_iterator_reinit(r, it);
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}